

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

bool COST_SENSITIVE::example_is_test(example *ec)

{
  size_t sVar1;
  wclass *pwVar2;
  long in_RDI;
  size_t j;
  v_array<COST_SENSITIVE::wclass> costs;
  ulong local_38;
  v_array<COST_SENSITIVE::wclass> local_30;
  
  local_30._begin = *(wclass **)(in_RDI + 0x6828);
  local_30._end = *(wclass **)(in_RDI + 0x6830);
  local_30.end_array = *(wclass **)(in_RDI + 0x6838);
  local_30.erase_count = *(size_t *)(in_RDI + 0x6840);
  sVar1 = v_array<COST_SENSITIVE::wclass>::size(&local_30);
  if (sVar1 != 0) {
    for (local_38 = 0; sVar1 = v_array<COST_SENSITIVE::wclass>::size(&local_30), local_38 < sVar1;
        local_38 = local_38 + 1) {
      pwVar2 = v_array<COST_SENSITIVE::wclass>::operator[](&local_30,local_38);
      if ((pwVar2->x != 3.4028235e+38) || (NAN(pwVar2->x))) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool example_is_test(example& ec)
{
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  if (costs.size() == 0)
    return true;
  for (size_t j = 0; j < costs.size(); j++)
    if (costs[j].x != FLT_MAX)
      return false;
  return true;
}